

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O3

void __thiscall Lodtalk::StackMemory::makeBaseFrame(StackMemory *this,Context *context)

{
  uint8_t *puVar1;
  StackPage *pSVar2;
  StackPage *pSVar3;
  
  pSVar3 = allocatePage(this);
  if (this->currentPage->previousPage == (StackPage *)0x0) {
    puVar1 = pSVar3->stackPageHighest;
    pSVar3->baseFramePointer = puVar1;
    (pSVar3->headFrame).framePointer = (uint8_t *)0x0;
    (pSVar3->headFrame).stackPointer = puVar1;
    pSVar2 = this->currentPage;
    pSVar3->nextPage = pSVar2;
    pSVar2->previousPage = pSVar3;
    return;
  }
  __assert_fail("!currentPage->previousPage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0x11b,"void Lodtalk::StackMemory::makeBaseFrame(Context *)");
}

Assistant:

void StackMemory::makeBaseFrame(Context *context)
{
    auto basePage = allocatePage();
    assert(!currentPage->previousPage);
    basePage->startUsing();
    basePage->nextPage = currentPage;
    currentPage->previousPage = basePage;


}